

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::startsWith(string *s,string *prefix)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (s->_M_string_length < prefix->_M_string_length) {
    _Var1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)s);
    _Var1 = std::operator==(&local_30,prefix);
    std::__cxx11::string::_M_dispose();
  }
  return _Var1;
}

Assistant:

bool startsWith( std::string const& s, std::string const& prefix ) {
        return s.size() >= prefix.size() && s.substr( 0, prefix.size() ) == prefix;
    }